

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.cpp
# Opt level: O1

void __thiscall wasm::Thread::~Thread(Thread *this)

{
  _Manager_type p_Var1;
  thread *ptVar2;
  int iVar3;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  this->done = true;
  std::condition_variable::notify_one();
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  std::thread::join();
  p_Var1 = (this->doWork).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->doWork,(_Any_data *)&this->doWork,__destroy_functor);
  }
  std::condition_variable::~condition_variable(&this->condition);
  ptVar2 = (this->thread)._M_t.super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>
           ._M_t.super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
           super__Head_base<0UL,_std::thread_*,_false>._M_head_impl;
  if (ptVar2 != (thread *)0x0) {
    if ((ptVar2->_M_id)._M_thread != 0) {
      std::terminate();
    }
    operator_delete(ptVar2,8);
  }
  (this->thread)._M_t.super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
  super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = (thread *)0x0;
  return;
}

Assistant:

Thread::~Thread() {
  {
    std::lock_guard<std::mutex> lock(mutex);
    // notify the thread that it can exit
    done = true;
    condition.notify_one();
  }
  thread->join();
}